

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness-traversal.h
# Opt level: O0

LocalGet * __thiscall
wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::getCopy
          (LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *this,
          LocalSet *set)

{
  If *pIVar1;
  LocalGet *get_2;
  LocalGet *get_1;
  If *iff;
  LocalGet *get;
  LocalSet *set_local;
  LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *this_local;
  
  this_local = (LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
               Expression::dynCast<wasm::LocalGet>(set->value);
  if ((this_local ==
       (LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)0x0) &&
     ((pIVar1 = Expression::dynCast<wasm::If>(set->value), pIVar1 == (If *)0x0 ||
      ((this_local = (LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                      *)Expression::dynCast<wasm::LocalGet>(pIVar1->ifTrue),
       this_local ==
       (LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)0x0 &&
       ((pIVar1->ifFalse == (Expression *)0x0 ||
        (this_local = (LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                       *)Expression::dynCast<wasm::LocalGet>(pIVar1->ifFalse),
        this_local ==
        (LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)0x0)))))))
     ) {
    this_local = (LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
                 0x0;
  }
  return (LocalGet *)this_local;
}

Assistant:

LocalGet* getCopy(LocalSet* set) {
    if (auto* get = set->value->dynCast<LocalGet>()) {
      return get;
    }
    if (auto* iff = set->value->dynCast<If>()) {
      if (auto* get = iff->ifTrue->dynCast<LocalGet>()) {
        return get;
      }
      if (iff->ifFalse) {
        if (auto* get = iff->ifFalse->dynCast<LocalGet>()) {
          return get;
        }
      }
    }
    return nullptr;
  }